

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdflib.c
# Opt level: O0

void bdf_free_font(bdf_font_t *font)

{
  FT_Memory memory_00;
  FT_Memory memory;
  bdf_glyph_t *glyphs;
  unsigned_long i;
  bdf_property_t *prop;
  bdf_font_t *font_local;
  
  if (font != (bdf_font_t *)0x0) {
    memory_00 = font->memory;
    ft_mem_free(memory_00,font->name);
    font->name = (char *)0x0;
    if (font->internal != (void *)0x0) {
      ft_hash_str_free((FT_Hash)font->internal,memory_00);
      ft_mem_free(memory_00,font->internal);
      font->internal = (void *)0x0;
    }
    ft_mem_free(memory_00,font->comments);
    font->comments = (char *)0x0;
    for (glyphs = (bdf_glyph_t *)0x0; glyphs < (bdf_glyph_t *)font->props_size;
        glyphs = (bdf_glyph_t *)((long)&glyphs->name + 1)) {
      if (font->props[(long)glyphs].format == 1) {
        ft_mem_free(memory_00,font->props[(long)glyphs].value.atom);
        font->props[(long)glyphs].value.atom = (char *)0x0;
      }
    }
    ft_mem_free(memory_00,font->props);
    font->props = (bdf_property_t *)0x0;
    glyphs = (bdf_glyph_t *)0x0;
    memory = (FT_Memory)font->glyphs;
    for (; glyphs < (bdf_glyph_t *)font->glyphs_used;
        glyphs = (bdf_glyph_t *)((long)&glyphs->name + 1)) {
      ft_mem_free(memory_00,memory->user);
      memory->user = (void *)0x0;
      ft_mem_free(memory_00,memory[1].user);
      memory[1].user = (void *)0x0;
      memory = (FT_Memory)&memory[1].realloc;
    }
    glyphs = (bdf_glyph_t *)0x0;
    memory = (FT_Memory)font->unencoded;
    for (; glyphs < (bdf_glyph_t *)font->unencoded_used;
        glyphs = (bdf_glyph_t *)((long)&glyphs->name + 1)) {
      ft_mem_free(memory_00,memory->user);
      memory->user = (void *)0x0;
      ft_mem_free(memory_00,memory[1].user);
      memory[1].user = (void *)0x0;
      memory = (FT_Memory)&memory[1].realloc;
    }
    ft_mem_free(memory_00,font->glyphs);
    font->glyphs = (bdf_glyph_t *)0x0;
    ft_mem_free(memory_00,font->unencoded);
    font->unencoded = (bdf_glyph_t *)0x0;
    glyphs = (bdf_glyph_t *)0x0;
    memory = (FT_Memory)(font->overflow).glyphs;
    for (; glyphs < (bdf_glyph_t *)(font->overflow).glyphs_used;
        glyphs = (bdf_glyph_t *)((long)&glyphs->name + 1)) {
      ft_mem_free(memory_00,memory->user);
      memory->user = (void *)0x0;
      ft_mem_free(memory_00,memory[1].user);
      memory[1].user = (void *)0x0;
      memory = (FT_Memory)&memory[1].realloc;
    }
    ft_mem_free(memory_00,(font->overflow).glyphs);
    (font->overflow).glyphs = (bdf_glyph_t *)0x0;
    ft_hash_str_free(&font->proptbl,memory_00);
    i = (unsigned_long)font->user_props;
    for (glyphs = (bdf_glyph_t *)0x0; glyphs < (bdf_glyph_t *)font->nuser_props;
        glyphs = (bdf_glyph_t *)((long)&glyphs->name + 1)) {
      ft_mem_free(memory_00,*(void **)i);
      *(undefined8 *)i = 0;
      if (*(int *)(i + 8) == 1) {
        ft_mem_free(memory_00,*(void **)(i + 0x10));
        *(undefined8 *)(i + 0x10) = 0;
      }
      i = i + 0x18;
    }
    ft_mem_free(memory_00,font->user_props);
    font->user_props = (bdf_property_t *)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  bdf_free_font( bdf_font_t*  font )
  {
    bdf_property_t*  prop;
    unsigned long    i;
    bdf_glyph_t*     glyphs;
    FT_Memory        memory;


    if ( font == 0 )
      return;

    memory = font->memory;

    FT_FREE( font->name );

    /* Free up the internal hash table of property names. */
    if ( font->internal )
    {
      ft_hash_str_free( (FT_Hash)font->internal, memory );
      FT_FREE( font->internal );
    }

    /* Free up the comment info. */
    FT_FREE( font->comments );

    /* Free up the properties. */
    for ( i = 0; i < font->props_size; i++ )
    {
      if ( font->props[i].format == BDF_ATOM )
        FT_FREE( font->props[i].value.atom );
    }

    FT_FREE( font->props );

    /* Free up the character info. */
    for ( i = 0, glyphs = font->glyphs;
          i < font->glyphs_used; i++, glyphs++ )
    {
      FT_FREE( glyphs->name );
      FT_FREE( glyphs->bitmap );
    }

    for ( i = 0, glyphs = font->unencoded; i < font->unencoded_used;
          i++, glyphs++ )
    {
      FT_FREE( glyphs->name );
      FT_FREE( glyphs->bitmap );
    }

    FT_FREE( font->glyphs );
    FT_FREE( font->unencoded );

    /* Free up the overflow storage if it was used. */
    for ( i = 0, glyphs = font->overflow.glyphs;
          i < font->overflow.glyphs_used; i++, glyphs++ )
    {
      FT_FREE( glyphs->name );
      FT_FREE( glyphs->bitmap );
    }

    FT_FREE( font->overflow.glyphs );

    /* bdf_cleanup */
    ft_hash_str_free( &(font->proptbl), memory );

    /* Free up the user defined properties. */
    for ( prop = font->user_props, i = 0;
          i < font->nuser_props; i++, prop++ )
    {
      FT_FREE( prop->name );
      if ( prop->format == BDF_ATOM )
        FT_FREE( prop->value.atom );
    }

    FT_FREE( font->user_props );

    /* FREE( font ); */ /* XXX Fixme */
  }